

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

TrieNode<unsigned_char> * pseudo_sample<unsigned_char>(uchar **strings,size_t n)

{
  uchar *ptr;
  ulong uVar1;
  byte bVar2;
  TrieNode<unsigned_char> *this;
  TrieNode<unsigned_char> *this_00;
  ulong uVar3;
  ulong uVar4;
  size_t depth;
  TrieNode<unsigned_char> *pTVar5;
  long lVar6;
  
  this = (TrieNode<unsigned_char> *)operator_new(0x820);
  TrieNode<unsigned_char>::TrieNode(this);
  lVar6 = 0x3857;
  uVar3 = 0;
  do {
    if (n <= uVar3) {
      return this;
    }
    ptr = strings[uVar3];
    depth = 0;
    pTVar5 = this;
    while (bVar2 = get_char<unsigned_char>(ptr,depth), bVar2 != 0) {
      uVar4 = (ulong)bVar2;
      uVar1 = (pTVar5->is_trie).super__Base_bitset<4UL>._M_w[bVar2 >> 6];
      if ((uVar1 >> (uVar4 & 0x3f) & 1) == 0) {
        (pTVar5->is_trie).super__Base_bitset<4UL>._M_w[bVar2 >> 6] = uVar1 | 1L << (bVar2 & 0x3f);
        this_00 = (TrieNode<unsigned_char> *)operator_new(0x820);
        TrieNode<unsigned_char>::TrieNode(this_00);
        (pTVar5->buckets)._M_elems[uVar4] = this_00;
        lVar6 = lVar6 + -1;
        if (lVar6 == 0) {
          return this;
        }
      }
      else {
        this_00 = (TrieNode<unsigned_char> *)(pTVar5->buckets)._M_elems[uVar4];
      }
      depth = depth + 1;
      pTVar5 = this_00;
      if (this_00 == (TrieNode<unsigned_char> *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                      ,0xcb,
                      "TrieNode<CharT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char]"
                     );
      }
    }
    uVar3 = uVar3 + 0x2000;
  } while( true );
}

Assistant:

static TrieNode<CharT>*
pseudo_sample(unsigned char** strings, size_t n)
{
	// Limit the maximum number of nodes to whatever fits in 30 megabytes.
	debug()<<__func__<<"(): sampling "<<n/8192<<" strings ...\n";
	size_t max_nodes = 30000000/sizeof(TrieNode<CharT>);
	TrieNode<CharT>* root = new TrieNode<CharT>;
	for (size_t i=0; i < n; i += 8192) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		TrieNode<CharT>* node = root;
		while (true) {
			CharT c = get_char<CharT>(str, depth);
			if (is_end(c)) break;
			depth += sizeof(CharT);
			if (not node->is_trie[c]) {
				node->is_trie[c] = true;
				node->buckets[c] = new TrieNode<CharT>;
				if (--max_nodes==0) goto finish;
			}
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			assert(node);
		}
	}
finish:
	debug()<<"   Sampling done, created "
	       <<(30000000/sizeof(TrieNode<CharT>))-max_nodes<<" nodes.\n";
	return root;
}